

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode128Reader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::OneD::Code128Reader::decodePattern
          (Barcode *__return_storage_ptr__,Code128Reader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  Iterator puVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  int xStart;
  uint uVar5;
  bool start;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  long lVar7;
  anon_class_16_2_7a905435 isGuard;
  ByteArray rawCodes;
  Error error;
  Raw2TxtDecoder raw2txt;
  Error local_b0;
  Error local_80;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined8 local_3f;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  isGuard.minQuietZone = 5.0;
  isGuard.pattern = (FixedPattern<3,_4,_false> *)param_3;
  FindLeftGuard<3,ZXing::FindLeftGuard<3,4,false>(ZXing::PatternView_const&,int,ZXing::FixedPattern<3,4,false>const&,double)::_lambda(ZXing::PatternView_const&,int)_1_>
            ((PatternView *)&raw2txt,(ZXing *)next,(PatternView *)0x18,0x19f874,isGuard);
  next->_base = (Iterator)raw2txt.txt._M_dataplus._M_p;
  next->_end = (Iterator)raw2txt.txt._M_string_length;
  next->_data = (Iterator)CONCAT44(raw2txt._symbologyIdentifier,raw2txt.codeSet);
  *(ulong *)&next->_size = CONCAT71(raw2txt._9_7_,raw2txt._readerInit);
  bVar3 = PatternView::isValid(next);
  if (bVar3) {
    next->_size = 6;
    iVar4 = decodePattern::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)next,(PatternView *)0x1,start);
    if (iVar4 - 0x67U < 3) {
      xStart = PatternView::pixelsInFront(next);
      rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                (&rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0x14);
      raw2txt.codeSet = CONCAT31(raw2txt.codeSet._1_3_,(char)iVar4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                 (uchar *)&raw2txt);
      Raw2TxtDecoder::Raw2TxtDecoder(&raw2txt,iVar4);
      uVar6 = extraout_RDX;
      while( true ) {
        if ((next->_data == (Iterator)0x0) ||
           (puVar1 = next->_data + next->_size, next->_data = puVar1,
           next->_end < puVar1 + next->_size)) goto LAB_0016f62f;
        iVar4 = decodePattern::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)next,(PatternView *)0x0,SUB81(uVar6,0));
        if (iVar4 == 0x6a) break;
        if (((iVar4 == -1) || (0x66 < iVar4)) ||
           (bVar3 = Raw2TxtDecoder::decode(&raw2txt,iVar4), !bVar3)) {
          memset(__return_storage_ptr__,0,0xd8);
          Result::Result(__return_storage_ptr__);
          goto LAB_0016f646;
        }
        error._msg._M_dataplus._M_p._0_1_ = (char)iVar4;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   (uchar *)&error);
        uVar6 = extraout_RDX_00;
      }
      if (2 < (int)rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
              (int)rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) {
        next->_size = 7;
        bVar3 = PatternView::isValid(next);
        if (((bVar3) &&
            (uVar2 = next->_data[6], iVar4 = PatternView::sum(next,6), (int)(uint)uVar2 <= iVar4 / 4
            )) && (bVar3 = PatternView::hasQuietZoneAfter<true>(next,0.3846154), bVar3)) {
          error._msg._M_dataplus._M_p = (pointer)&error._msg.field_2;
          error._msg._M_string_length = 0;
          error._msg.field_2._M_local_buf[0] = '\0';
          error._file = (char *)0x0;
          error._line = -1;
          error._type = None;
          uVar5 = (uint)*rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          for (lVar7 = 1;
              lVar7 < (int)(~(uint)rawCodes.
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (int)rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish); lVar7 = lVar7 + 1) {
            uVar5 = uVar5 + (uint)rawCodes.
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar7] * (int)lVar7;
          }
          if (uVar5 % 0x67 !=
              (uint)rawCodes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1]) {
            local_50 = &local_40;
            local_b0._msg._M_dataplus._M_p = (pointer)&local_b0._msg.field_2;
            local_b0._msg.field_2._M_local_buf[0] = '\0';
            local_b0._msg.field_2._1_8_ = local_3f;
            local_b0._msg.field_2._9_4_ = local_37;
            local_b0._msg.field_2._13_2_ = local_33;
            local_b0._msg.field_2._M_local_buf[0xf] = local_31;
            local_b0._msg._M_string_length = 0;
            local_48 = 0;
            local_40 = 0;
            local_b0._file = "src/oned/ODCode128Reader.cpp";
            local_b0._line = 0xee;
            local_b0._type = Checksum;
            Error::operator=(&error,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_50);
          }
          iVar4 = PatternView::pixelsTillEnd(next);
          Raw2TxtDecoder::text_abi_cxx11_(&local_b0._msg,&raw2txt);
          Error::Error(&local_80,&error);
          Result::Result(__return_storage_ptr__,&local_b0._msg,rowNumber,xStart,iVar4,Code128,
                         raw2txt._symbologyIdentifier,&local_80,raw2txt._readerInit);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&error);
          goto LAB_0016f646;
        }
      }
LAB_0016f62f:
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
LAB_0016f646:
      std::__cxx11::string::~string((string *)&raw2txt.txt);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&rawCodes);
      return __return_storage_ptr__;
    }
  }
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Barcode Code128Reader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	int minCharCount = 4; // start + payload + checksum + stop
	auto decodePattern = [](const PatternView& view, bool start = false) {
		// This is basically the reference algorithm from the specification
		int code = IndexOf(E2E_PATTERNS, ToInt(NormalizedE2EPattern<CHAR_LEN, CHAR_SUM>(view)));
		if (code == -1 && !start) // if the reference algo fails, give the original upstream version a try (required to decode a few samples)
			code = DecodeDigit(view, Code128::CODE_PATTERNS, MAX_AVG_VARIANCE, MAX_INDIVIDUAL_VARIANCE);
		return code;
	};

	next = FindLeftGuard(next, minCharCount * CHAR_LEN, START_PATTERN_PREFIX, QUIET_ZONE);
	if (!next.isValid())
		return {};

	next = next.subView(0, CHAR_LEN);
	int startCode = decodePattern(next, true);
	if (!(CODE_START_A <= startCode && startCode <= CODE_START_C))
		return {};

	int xStart = next.pixelsInFront();
	ByteArray rawCodes;
	rawCodes.reserve(20);
	rawCodes.push_back(narrow_cast<uint8_t>(startCode));

	Raw2TxtDecoder raw2txt(startCode);

	while (true) {
		if (!next.skipSymbol())
			return {};

		// Decode another code from image
		int code = decodePattern(next);
		if (code == -1)
			return {};
		if (code == CODE_STOP)
			break;
		if (code >= CODE_START_A)
			return {};
		if (!raw2txt.decode(code))
			return {};

		rawCodes.push_back(narrow_cast<uint8_t>(code));
	}

	if (Size(rawCodes) < minCharCount - 1) // stop code is missing in rawCodes
		return {};

	// check termination bar (is present and not wider than about 2 modules) and quiet zone (next is now 13 modules
	// wide, require at least 8)
	next = next.subView(0, CHAR_LEN + 1);
	if (!next.isValid() || next[CHAR_LEN] > next.sum(CHAR_LEN) / 4 || !next.hasQuietZoneAfter(QUIET_ZONE/13))
		return {};

	Error error;
	int checksum = rawCodes.front();
	for (int i = 1; i < Size(rawCodes) - 1; ++i)
		checksum += i * rawCodes[i];
	// the last code is the checksum:
	if (checksum % 103 != rawCodes.back())
		error = ChecksumError();

	int xStop = next.pixelsTillEnd();
	return Barcode(raw2txt.text(), rowNumber, xStart, xStop, BarcodeFormat::Code128, raw2txt.symbologyIdentifier(), error,
				   raw2txt.readerInit());
}